

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::dashtrailing(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Char CVar1;
  uint uVar2;
  uint Value;
  
  requireDStackDepth(this,2,"COUNT");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  Value = ForthStack<unsigned_int>::getTop(this_00,0);
  do {
    if ((int)Value < 1) goto LAB_0011b68f;
    CVar1 = dataSpaceAt(this,(uVar2 - 1) + Value);
    Value = Value - 1;
  } while (CVar1 == ' ');
  Value = (Value - (CVar1 == ' ')) + 1;
LAB_0011b68f:
  ForthStack<unsigned_int>::setTop(this_00,Value);
  return;
}

Assistant:

void dashtrailing() {
			REQUIRE_DSTACK_DEPTH(2, "COUNT");
			auto caddr = CADDR(dStack.getTop(1));
			SCell count = dStack.getTop(0);
			while(count>0){
			auto trailingChar = (getDataChar(caddr+count-1));
			if(trailingChar==' '){
				count--;
			} else {
				break;
			}
			}
			//Nothing done
			dStack.setTop(static_cast<Cell>(count));
		}